

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyDefaultString_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyDefaultString_Test
          (NoFieldPresenceMapSerializeTest_MapRoundTripZeroKeyDefaultString_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->
  super_NoFieldPresenceMapSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__NoFieldPresenceMapSerializeTest_0190d120;
  pcVar2 = (this->
           super_NoFieldPresenceMapSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).value_._M_dataplus._M_p;
  paVar1 = &(this->
            super_NoFieldPresenceMapSerializeTest<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest, MapRoundTripZeroKeyDefaultString) {
  TestAllMapTypes msg;
  (*msg.mutable_map_int32_bytes())[0];

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  EXPECT_THAT(rt_msg.map_int32_bytes(),
              UnorderedPointwise(Eq(), msg.map_int32_bytes()));

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ("", rt_msg.map_int32_bytes().at(0));
}